

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O1

TestMatrixType deqp::gles2::Functional::MatrixCaseUtils::getOperationTestMatrixType(MatrixOp op)

{
  TestMatrixType TVar1;
  
  TVar1 = TESTMATRIXTYPE_LAST;
  if (op < OP_LAST) {
    TVar1 = *(TestMatrixType *)(&DAT_01bff948 + (ulong)op * 4);
  }
  return TVar1;
}

Assistant:

static TestMatrixType getOperationTestMatrixType (MatrixOp op)
{
	switch(op)
	{
		case OP_ADD:			return TESTMATRIXTYPE_DEFAULT;
		case OP_SUB:			return TESTMATRIXTYPE_DEFAULT;
		case OP_MUL:			return TESTMATRIXTYPE_DEFAULT;
		case OP_DIV:			return TESTMATRIXTYPE_DEFAULT;
		case OP_COMP_MUL:		return TESTMATRIXTYPE_DEFAULT;
		case OP_UNARY_PLUS:		return TESTMATRIXTYPE_DEFAULT;
		case OP_NEGATION:		return TESTMATRIXTYPE_NEGATED;
		case OP_PRE_INCREMENT:	return TESTMATRIXTYPE_NEGATED;
		case OP_PRE_DECREMENT:	return TESTMATRIXTYPE_INCREMENTED;
		case OP_POST_INCREMENT:	return TESTMATRIXTYPE_NEGATED;
		case OP_POST_DECREMENT:	return TESTMATRIXTYPE_DEFAULT;
		case OP_ADD_INTO:		return TESTMATRIXTYPE_DECREMENTED;
		case OP_SUBTRACT_FROM:	return TESTMATRIXTYPE_DEFAULT;
		case OP_MULTIPLY_INTO:	return TESTMATRIXTYPE_DEFAULT;
		case OP_DIVIDE_INTO:	return TESTMATRIXTYPE_DEFAULT;

		default:
			DE_ASSERT(DE_FALSE);
			return TESTMATRIXTYPE_LAST;
	}
}